

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraInit_cpp.h
# Opt level: O0

void __thiscall moira::Moira::createJumpTable(Moira *this,Model cpuModel,Model dasmModel)

{
  Core CVar1;
  Core CVar2;
  Core dasmCore;
  Core cpuCore;
  Core CStack_14;
  anon_class_1_0_00000001 core;
  Model dasmModel_local;
  Model cpuModel_local;
  Moira *this_local;
  
  cpuCore = dasmModel;
  CStack_14 = cpuModel;
  CVar1 = createJumpTable::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&dasmCore + 3),cpuModel);
  CVar2 = createJumpTable::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&dasmCore + 3),cpuCore);
  if (CVar2 == C68000) {
    createJumpTable<(moira::Core)0>(this,cpuCore,true);
  }
  if (CVar2 == C68010) {
    createJumpTable<(moira::Core)1>(this,cpuCore,true);
  }
  if (CVar2 == C68020) {
    createJumpTable<(moira::Core)2>(this,cpuCore,true);
  }
  if (CStack_14 != cpuCore) {
    if (CVar1 == C68000) {
      createJumpTable<(moira::Core)0>(this,CStack_14,false);
    }
    if (CVar1 == C68010) {
      createJumpTable<(moira::Core)1>(this,CStack_14,false);
    }
    if (CVar1 == C68020) {
      createJumpTable<(moira::Core)2>(this,CStack_14,false);
    }
  }
  return;
}

Assistant:

void
Moira::createJumpTable(Model cpuModel, Model dasmModel)
{
    auto core = [&](Model model) {
        
        switch (model) {
                
            case Model::M68000: return Core::C68000;
            case Model::M68010: return Core::C68010;
                
            default:
                return Core::C68020;
        }
    };

    Core cpuCore = core(cpuModel);
    Core dasmCore = core(dasmModel);

    // Register handlers based on the dasm model
    if (dasmCore == Core::C68000) createJumpTable<Core::C68000>(dasmModel, true);
    if (dasmCore == Core::C68010) createJumpTable<Core::C68010>(dasmModel, true);
    if (dasmCore == Core::C68020) createJumpTable<Core::C68020>(dasmModel, true);

    // If both models differ, overwrite the exec handlers
    if (cpuModel != dasmModel) {

        if (cpuCore == Core::C68000) createJumpTable<Core::C68000>(cpuModel, false);
        if (cpuCore == Core::C68010) createJumpTable<Core::C68010>(cpuModel, false);
        if (cpuCore == Core::C68020) createJumpTable<Core::C68020>(cpuModel, false);
    }
}